

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O1

l2_expr_info *
l2_eval_expr_mul_div_mod1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  l2_expr_info left_expr_info_00;
  l2_expr_val_type lVar1;
  boolean bVar2;
  l2_token *plVar3;
  char *pcVar4;
  int cols;
  int lines;
  l2_parsing_error_type error_type;
  char *pcVar5;
  char *pcVar6;
  l2_expr_info local_40;
  
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_MUL);
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_DIV);
    if (bVar2 != '\0') {
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_single(&local_40,scope_p);
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          local_40.val_type = L2_EXPR_VAL_TYPE_INTEGER;
          if ((int)local_40.val.integer != 0) {
            local_40.val.integer = left_expr_info.val.integer / (long)(int)local_40.val.integer;
            goto LAB_0010aa5b;
          }
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          error_type = L2_PARSING_ERROR_DIVIDE_BY_ZERO;
          goto LAB_0010abf3;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          left_expr_info.val.real = (double)left_expr_info.val.integer;
          goto LAB_0010aa51;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = "/";
LAB_0010abda:
          pcVar5 = "integer";
          goto LAB_0010acb4;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
            local_40.val.real = (double)local_40.val.integer;
          }
          else if (local_40.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
              lines = plVar3->current_line;
              cols = plVar3->current_col;
              pcVar4 = "/";
              goto LAB_0010acad;
            }
            goto LAB_0010abe6;
          }
LAB_0010aa51:
          local_40.val.real = left_expr_info.val.real / local_40.val.real;
          goto LAB_0010aa55;
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = "/";
LAB_0010ac7e:
            pcVar5 = "bool";
            pcVar6 = pcVar5;
            goto LAB_0010acc0;
          }
          if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = "/";
LAB_0010ac96:
            pcVar5 = "bool";
            goto LAB_0010ac9d;
          }
          if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
            pcVar4 = "/";
LAB_0010ab9a:
            pcVar5 = "bool";
            goto LAB_0010aba1;
          }
          goto LAB_0010abee;
        }
      }
      goto LAB_0010abe6;
    }
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_MOD);
    if (bVar2 == '\0') {
      (__return_storage_ptr__->val).procedure.upper_scope_p =
           left_expr_info.val.procedure.upper_scope_p;
      *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
      (__return_storage_ptr__->val).real = left_expr_info.val.real;
      return __return_storage_ptr__;
    }
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_single(&local_40,scope_p);
    lVar1 = local_40.val_type;
    local_40.val_type = L2_EXPR_VAL_TYPE_INTEGER;
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      if (lVar1 == L2_EXPR_VAL_TYPE_INTEGER) {
        local_40.val.integer = left_expr_info.val.integer % local_40.val.integer;
        goto LAB_0010aa5b;
      }
      if (lVar1 == L2_EXPR_VAL_TYPE_REAL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "%";
        pcVar5 = "integer";
LAB_0010ac9d:
        pcVar6 = "real";
        goto LAB_0010acc0;
      }
      if (lVar1 == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "%";
        goto LAB_0010abda;
      }
      goto LAB_0010abe6;
    }
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
      lines = plVar3->current_line;
      cols = plVar3->current_col;
      if (lVar1 == L2_EXPR_VAL_TYPE_BOOL) {
        pcVar4 = "%";
LAB_0010acad:
        pcVar5 = "real";
LAB_0010acb4:
        pcVar6 = "bool";
LAB_0010acc0:
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,lines,cols,
                         pcVar4,pcVar5,pcVar6);
      }
      if (lVar1 == L2_EXPR_VAL_TYPE_REAL) {
        pcVar4 = "%";
        pcVar5 = "real";
        pcVar6 = pcVar5;
        goto LAB_0010acc0;
      }
      if (lVar1 == L2_EXPR_VAL_TYPE_INTEGER) {
        pcVar4 = "%";
        pcVar5 = "real";
LAB_0010aba1:
        pcVar6 = "integer";
        goto LAB_0010acc0;
      }
    }
    else {
      if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) goto LAB_0010abe6;
      lines = plVar3->current_line;
      cols = plVar3->current_col;
      if (lVar1 == L2_EXPR_VAL_TYPE_BOOL) {
        pcVar4 = "%";
        goto LAB_0010ac7e;
      }
      if (lVar1 == L2_EXPR_VAL_TYPE_REAL) {
        pcVar4 = "%";
        goto LAB_0010ac96;
      }
      if (lVar1 == L2_EXPR_VAL_TYPE_INTEGER) {
        pcVar4 = "%";
        goto LAB_0010ab9a;
      }
    }
  }
  else {
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_single(&local_40,scope_p);
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        local_40.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        local_40.val.integer = local_40.val.integer * left_expr_info.val.integer;
        goto LAB_0010aa5b;
      }
      if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
        local_40.val_type = L2_EXPR_VAL_TYPE_REAL;
        local_40.val.real = local_40.val.real * (double)left_expr_info.val.integer;
        goto LAB_0010aa5b;
      }
      if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "*";
        goto LAB_0010abda;
      }
    }
    else {
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          local_40.val.real = (double)local_40.val.integer;
        }
        else if (local_40.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            lines = plVar3->current_line;
            cols = plVar3->current_col;
            pcVar4 = "*";
            goto LAB_0010acad;
          }
          goto LAB_0010abe6;
        }
        local_40.val.real = local_40.val.real * left_expr_info.val.real;
LAB_0010aa55:
        local_40.val_type = L2_EXPR_VAL_TYPE_REAL;
LAB_0010aa5b:
        left_expr_info_00._4_4_ = local_40._4_4_;
        left_expr_info_00.val_type = local_40.val_type;
        left_expr_info_00.val.real = local_40.val.real;
        left_expr_info_00.val.procedure.upper_scope_p = local_40.val.procedure.upper_scope_p;
        l2_eval_expr_lshift_rshift_rshift_unsigned1
                  (__return_storage_ptr__,scope_p,left_expr_info_00);
        return __return_storage_ptr__;
      }
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        if (local_40.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          pcVar4 = "*";
          goto LAB_0010ac7e;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_REAL) {
          pcVar4 = "*";
          goto LAB_0010ac96;
        }
        if (local_40.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          pcVar4 = "*";
          goto LAB_0010ab9a;
        }
        goto LAB_0010abee;
      }
    }
LAB_0010abe6:
    lines = plVar3->current_line;
    cols = plVar3->current_col;
  }
LAB_0010abee:
  error_type = L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE;
LAB_0010abf3:
  l2_parsing_error(error_type,lines,cols);
}

Assistant:

l2_expr_info l2_eval_expr_mul_div_mod1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_MUL) /* * */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_single(scope_p);
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                        new_left_expr_info.val.integer = (left_expr_info.val.integer * right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.integer * right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real * right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real * right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_DIV) /* / */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_single(scope_p);
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                        new_left_expr_info.val.integer = (left_expr_info.val.integer / l2_eval_div_by_zero_filter(right_expr_info.val.integer, current_token_p->current_line, current_token_p->current_col));
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.integer / right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real / right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real / right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_MOD) /* % */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_single(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer % right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}